

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O3

void runOnce<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  int iVar4;
  Sequence *pSVar5;
  ulong uVar6;
  atomic<long> *paVar7;
  ostream *poVar8;
  ulong uVar9;
  Sequence *pSVar10;
  long *plVar11;
  long *plVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64> s;
  string local_340;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_320;
  long *local_300;
  reference_wrapper<disruptor::Sequence> local_2f8;
  undefined1 local_2f0 [32];
  long *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [504];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_c8 [6];
  undefined1 auVar15 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Staring run ",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  LOCK();
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  UNLOCK();
  uVar9 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar9;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x78),8) == 0) {
    uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  }
  pSVar5 = (Sequence *)operator_new__(uVar6);
  auVar2 = _DAT_00129040;
  auVar1 = _DAT_00129030;
  if (uVar9 != 0) {
    uVar6 = uVar9 * 0x78 - 0x78;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar6;
    uVar14 = SUB164(auVar19 * ZEXT816(0x8888888888888889),8);
    uVar17 = (undefined4)(uVar6 / 0x1e0000000);
    auVar15._0_8_ = CONCAT44(uVar17,uVar14);
    auVar15._8_4_ = uVar14;
    auVar15._12_4_ = uVar17;
    auVar16._0_8_ = auVar15._0_8_ >> 6;
    auVar16._8_8_ = auVar15._8_8_ >> 6;
    paVar7 = &pSVar5[1].sequence_;
    uVar9 = 0;
    auVar16 = auVar16 ^ _DAT_00129040;
    do {
      auVar18._8_4_ = (int)uVar9;
      auVar18._0_8_ = uVar9;
      auVar18._12_4_ = (int)(uVar9 >> 0x20);
      auVar19 = (auVar18 | auVar1) ^ auVar2;
      if ((bool)(~(auVar19._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar19._0_4_ ||
                  auVar16._4_4_ < auVar19._4_4_) & 1)) {
        paVar7[-0xf] = (__atomic_base<long>)0xffffffffffffffff;
      }
      if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
          auVar19._12_4_ <= auVar16._12_4_) {
        (paVar7->super___atomic_base<long>)._M_i = -1;
      }
      uVar9 = uVar9 + 2;
      paVar7 = paVar7 + 0x1e;
    } while ((uVar6 / 0x78 + 2 & 0xfffffffffffffffe) != uVar9);
  }
  sVar3 = RING_BUFFER_SIZE;
  local_320.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_320.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_320.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Sequence **)0x0;
  disruptor::RingBuffer<long,_64>::RingBuffer((RingBuffer<long,_64> *)local_2c0,RING_BUFFER_SIZE);
  local_2c0._184_8_ = -1;
  local_2c0._248_8_ = sVar3;
  local_2c0._312_8_ = -1;
  local_2c0._432_8_ = -1;
  local_2c0._496_8_ = &PTR_SignalAllWhenBlocking_001327c8;
  local_c8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < nc) {
    lVar13 = 0;
    pSVar10 = pSVar5;
    iVar4 = nc;
    do {
      local_340._M_dataplus._M_p = (pointer)pSVar10;
      if (local_320.
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_320.
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>>::
        _M_realloc_insert<disruptor::Sequence*>
                  ((vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>> *)&local_320,
                   (iterator)
                   local_320.
                   super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Sequence **)&local_340);
        iVar4 = nc;
      }
      else {
        *local_320.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
        local_320.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_320.
             super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar13 = lVar13 + 1;
      pSVar10 = pSVar10 + 1;
    } while (lVar13 < iVar4);
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::operator=
            (local_c8,&local_320);
  iVar4 = nc;
  lVar13 = (long)nc;
  uVar6 = lVar13 * 8;
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (lVar13 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_300 = (long *)operator_new__(uVar9);
  *local_300 = lVar13;
  plVar12 = local_300 + 1;
  if (iVar4 != 0) {
    memset(plVar12,0,uVar6);
    if (0 < iVar4) {
      lVar13 = 0;
      pSVar10 = pSVar5;
      do {
        local_2f0._0_8_ = local_2c0;
        local_2f8._M_data = pSVar10;
        std::thread::
        thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>>,std::reference_wrapper<disruptor::Sequence>,void>
                  ((thread *)&local_340,
                   consume<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>>,
                   (reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>_>
                    *)local_2f0,&local_2f8);
        if (plVar12[lVar13] != 0) goto LAB_0011be75;
        plVar12[lVar13] = (long)local_340._M_dataplus._M_p;
        lVar13 = lVar13 + 1;
        pSVar10 = pSVar10 + 1;
      } while (lVar13 < nc);
    }
  }
  iVar4 = np;
  lVar13 = (long)np;
  uVar6 = lVar13 * 8;
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (lVar13 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_2d0 = (long *)operator_new__(uVar9);
  *local_2d0 = lVar13;
  plVar12 = local_2d0 + 1;
  if (iVar4 != 0) {
    memset(plVar12,0,uVar6);
  }
  local_2c8 = std::chrono::_V2::system_clock::now();
  plVar11 = local_300;
  if (0 < np) {
    lVar13 = 0;
    do {
      local_2f0._0_8_ = local_2c0;
      std::thread::
      thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>,64>>,void>
                ((thread *)&local_340,
                 produce<long,disruptor::MultiThreadedStrategy,disruptor::YieldingStrategy<200l>>,
                 (reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>_>
                  *)local_2f0);
      plVar11 = local_300;
      if (plVar12[lVar13] != 0) goto LAB_0011be75;
      plVar12[lVar13] = (long)local_340._M_dataplus._M_p;
      lVar13 = lVar13 + 1;
    } while (lVar13 < np);
    if (0 < np) {
      lVar13 = 0;
      do {
        std::thread::join();
        lVar13 = lVar13 + 1;
      } while (lVar13 < np);
    }
  }
  if (0 < nc) {
    lVar13 = 0;
    do {
      std::thread::join();
      lVar13 = lVar13 + 1;
    } while (lVar13 < nc);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nBatch size: ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," Ring buffer size: ",0x13);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," Alignment: ",0xc);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x40);
  local_340._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_340,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cursor: ",8);
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  local_340._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_340,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum: ",5);
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," Expected sum: ",0xf);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  local_340._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_340,1);
  std::chrono::_V2::system_clock::now();
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,np);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"P-",2);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,nc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"C ",2);
  demangle_abi_cxx11_(&local_340,"N9disruptor21MultiThreadedStrategyE");
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_340._M_dataplus._M_p,local_340._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  demangle_abi_cxx11_((string *)local_2f0,"N9disruptor16YieldingStrategyILl200EEE");
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_2f0._0_8_,local_2f0._8_8_);
  local_2f8._M_data._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_2f8,1);
  if ((Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64> *)
      local_2f0._0_8_ !=
      (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64> *)
      (local_2f0 + 0x10)) {
    operator_delete((void *)local_2f0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ops/secs",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Milliseconds: ",0xe);
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
  if (*plVar11 != 0) {
    lVar13 = *plVar11 << 3;
    do {
      if (*(long *)((long)plVar11 + lVar13) != 0) goto LAB_0011be75;
      lVar13 = lVar13 + -8;
    } while (lVar13 != 0);
  }
  operator_delete__(plVar11);
  if (*local_2d0 != 0) {
    lVar13 = *local_2d0 << 3;
    do {
      if (*(long *)((long)local_2d0 + lVar13) != 0) {
LAB_0011be75:
        std::terminate();
      }
      lVar13 = lVar13 + -8;
    } while (lVar13 != 0);
  }
  operator_delete__(local_2d0);
  operator_delete__(pSVar5);
  if (local_c8[0].super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8[0].
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_2c0._64_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c0._64_8_);
  }
  if (local_320.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.
                    super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}